

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_context.cpp
# Opt level: O2

void __thiscall
jessilib::impl::timer_context::timer_context
          (timer_context *this,duration_t in_period,function_t *in_callback)

{
  timer_manager *ptVar1;
  rep rVar2;
  
  (this->super_enable_shared_from_this<jessilib::impl::timer_context>)._M_weak_this.
  super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<jessilib::impl::timer_context>)._M_weak_this.
  super___weak_ptr<jessilib::impl::timer_context,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_period).__r = in_period.__r;
  std::function<void_(jessilib::timer_&)>::function(&this->m_callback,in_callback);
  (this->m_next).__d.__r = 0;
  ptVar1 = timer_manager::instance();
  (this->m_self)._M_node = (_List_node_base *)&ptVar1->m_detached_timers;
  (this->m_mutex)._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x20) = 0;
  (this->m_mutex)._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->m_mutex)._M_impl._M_rwlock + 0x30) = 0;
  rVar2 = std::chrono::_V2::steady_clock::now();
  (this->m_last_fire_finish).__d.__r = rVar2;
  return;
}

Assistant:

timer_context::timer_context(duration_t in_period, function_t in_callback)
	: m_period{ in_period },
	// m_next{ calc_next() },
	m_callback{ std::move(in_callback) },
	m_self{ timer_manager::instance().m_detached_timers.end() },
	m_last_fire_finish{ std::chrono::steady_clock::now() } {
	// Empty ctor body
}